

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLSL__technique__pass__states__polygon_offset
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  undefined8 uVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  char cVar5;
  xmlChar **ppxVar6;
  
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  uVar1 = profile_GLSL__technique__pass__states__polygon_offset__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar3 =
       profile_GLSL__technique__pass__states__polygon_offset__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar3 + 8) = uVar1;
  uVar1 = profile_GLSL__technique__pass__states__polygon_offset__AttributeData::DEFAULT._24_8_;
  *(undefined8 *)(pbVar3 + 0x10) =
       profile_GLSL__technique__pass__states__polygon_offset__AttributeData::DEFAULT._16_8_;
  *(undefined8 *)(pbVar3 + 0x18) = uVar1;
  *attributeDataPtr = pbVar3;
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    do {
      text = *ppxVar6;
      if (text == (ParserChar *)0x0) {
        cVar5 = '\x03';
        goto LAB_007397a8;
      }
      SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar6[1];
      ppxVar6 = ppxVar6 + 2;
      if (SVar4 == 0x76887d) {
        *(ParserChar **)(pbVar3 + 0x18) = additionalText;
LAB_007397a6:
        cVar5 = '\0';
      }
      else if (SVar4 == 0x7c83b5) {
        bVar2 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                           ,additionalText,(XSList<float> *)(pbVar3 + 8));
        if (bVar2) {
          *pbVar3 = *pbVar3 | 1;
          cVar5 = '\x04';
          bVar2 = true;
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x4633a94,0x7c83b5,additionalText);
          bVar2 = !bVar2;
          cVar5 = bVar2 * '\x03' + '\x01';
        }
        if (bVar2) goto LAB_007397a6;
      }
      else {
        bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x4633a94,text,additionalText);
        cVar5 = '\x01';
        if (!bVar2) goto LAB_007397a6;
      }
LAB_007397a8:
    } while (cVar5 == '\0');
    if (cVar5 != '\x03') {
      return false;
    }
  }
  if (((*pbVar3 & 1) == 0) &&
     (bVar2 = GeneratedSaxParser::
              ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
              ::characterData2List<float,_&GeneratedSaxParser::Utils::toFloat>
                        (&this->
                          super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                         ,"0.0E1 0.0E1",(XSList<float> *)(pbVar3 + 8)), bVar2)) {
    *pbVar3 = *pbVar3 | 1;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLSL__technique__pass__states__polygon_offset( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__states__polygon_offset( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__states__polygon_offset__AttributeData* attributeData = newData<profile_GLSL__technique__pass__states__polygon_offset__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2FloatList(attributeValue, attributeData->value, 0, HASH_ELEMENT_POLYGON_OFFSET, HASH_ATTRIBUTE_VALUE);
    }
    else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2FloatList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_POLYGON_OFFSET,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__float2_type(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_POLYGON_OFFSET,
            HASH_ATTRIBUTE_VALUE,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLSL__technique__pass__states__polygon_offset__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_POLYGON_OFFSET,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_POLYGON_OFFSET, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLSL__technique__pass__states__polygon_offset__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    bool failed;
    failed = !characterData2FloatList("0.0E1 0.0E1", attributeData->value);
    if ( !failed )
    attributeData->present_attributes |= profile_GLSL__technique__pass__states__polygon_offset__AttributeData::ATTRIBUTE_VALUE_PRESENT;
}


    return true;
}